

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

Test * __thiscall
testing::internal::ParameterizedTestFactory<deflate_bound_variant_estimate_Test>::CreateTest
          (ParameterizedTestFactory<deflate_bound_variant_estimate_Test> *this)

{
  Test *this_00;
  
  WithParamInterface<deflate_bound_test>::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x18);
  Test::Test(this_00);
  this_00->_vptr_Test = (_func_int **)&PTR__TestWithParam_0019d818;
  this_00[1]._vptr_Test = (_func_int **)&PTR__deflate_bound_variant_estimate_Test_0019d858;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }